

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_config.c
# Opt level: O0

int read_av1config(uint8_t *buffer,size_t buffer_length,size_t *bytes_read,Av1Config *config)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  size_t sVar5;
  undefined1 *in_RCX;
  size_t *in_RDX;
  ulong in_RSI;
  long in_RDI;
  int initial_presentation_delay_minus_one;
  int initial_presentation_delay_present;
  int reserved;
  int chroma_sample_position;
  int chroma_subsampling_y;
  int chroma_subsampling_x;
  int monochrome;
  int twelve_bit;
  int high_bitdepth;
  int seq_tier_0;
  int seq_level_idx_0;
  int seq_profile;
  int version;
  int marker;
  aom_read_bit_buffer *reader;
  aom_read_bit_buffer reader_instance;
  int result;
  int in_stack_ffffffffffffff6c;
  uint in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  uint in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  aom_read_bit_buffer local_58;
  int local_2c;
  undefined1 *local_28;
  size_t *local_20;
  int local_4;
  
  if ((((in_RDI == 0) || (in_RSI < 4)) || (in_RDX == (size_t *)0x0)) ||
     (in_RCX == (undefined1 *)0x0)) {
    local_4 = -1;
  }
  else {
    *in_RDX = 0;
    local_2c = 0;
    local_58.bit_buffer_end = (uint8_t *)(in_RDI + in_RSI);
    local_58.bit_offset = 0;
    local_58.error_handler_data = &local_2c;
    local_58.error_handler = bitreader_error_handler;
    local_28 = in_RCX;
    local_20 = in_RDX;
    memset(in_RCX,0,0xd);
    uVar1 = aom_rb_read_bit((aom_read_bit_buffer *)
                            CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    if (local_2c == -1) {
      fprintf(_stderr,"av1c: Error reading bit for marker, value=%d result=%d.\n",(ulong)uVar1,
              0xffffffff);
      local_4 = -1;
    }
    else {
      *local_28 = (char)uVar1;
      uVar1 = aom_rb_read_literal((aom_read_bit_buffer *)
                                  CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                                  in_stack_ffffffffffffff6c);
      if (local_2c == -1) {
        fprintf(_stderr,"av1c: Could not read bits for version, value=%d result=%d.\n",(ulong)uVar1,
                0xffffffff);
        local_4 = -1;
      }
      else {
        local_28[1] = (char)uVar1;
        uVar1 = aom_rb_read_literal((aom_read_bit_buffer *)
                                    CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                                    in_stack_ffffffffffffff6c);
        if (local_2c == -1) {
          fprintf(_stderr,"av1c: Could not read bits for seq_profile, value=%d result=%d.\n",
                  (ulong)uVar1,0xffffffff);
          local_4 = -1;
        }
        else {
          local_28[2] = (char)uVar1;
          uVar1 = aom_rb_read_literal((aom_read_bit_buffer *)
                                      CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                                      in_stack_ffffffffffffff6c);
          if (local_2c == -1) {
            fprintf(_stderr,"av1c: Could not read bits for seq_level_idx_0, value=%d result=%d.\n",
                    (ulong)uVar1,0xffffffff);
            local_4 = -1;
          }
          else {
            local_28[3] = (char)uVar1;
            uVar1 = aom_rb_read_bit((aom_read_bit_buffer *)
                                    CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
            if (local_2c == -1) {
              fprintf(_stderr,"av1c: Error reading bit for seq_tier_0, value=%d result=%d.\n",
                      (ulong)uVar1,0xffffffff);
              local_4 = -1;
            }
            else {
              local_28[4] = (char)uVar1;
              uVar1 = aom_rb_read_bit((aom_read_bit_buffer *)
                                      CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78))
              ;
              if (local_2c == -1) {
                fprintf(_stderr,"av1c: Error reading bit for high_bitdepth, value=%d result=%d.\n",
                        (ulong)uVar1,0xffffffff);
                local_4 = -1;
              }
              else {
                local_28[5] = (char)uVar1;
                uVar1 = aom_rb_read_bit((aom_read_bit_buffer *)
                                        CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78
                                                ));
                if (local_2c == -1) {
                  fprintf(_stderr,"av1c: Error reading bit for twelve_bit, value=%d result=%d.\n",
                          (ulong)uVar1,0xffffffff);
                  local_4 = -1;
                }
                else {
                  local_28[6] = (char)uVar1;
                  uVar1 = aom_rb_read_bit((aom_read_bit_buffer *)
                                          CONCAT44(in_stack_ffffffffffffff7c,
                                                   in_stack_ffffffffffffff78));
                  if (local_2c == -1) {
                    fprintf(_stderr,"av1c: Error reading bit for monochrome, value=%d result=%d.\n",
                            (ulong)uVar1,0xffffffff);
                    local_4 = -1;
                  }
                  else {
                    local_28[7] = (char)uVar1;
                    uVar1 = aom_rb_read_bit((aom_read_bit_buffer *)(ulong)in_stack_ffffffffffffff78)
                    ;
                    if (local_2c == -1) {
                      fprintf(_stderr,
                              "av1c: Error reading bit for chroma_subsampling_x, value=%d result=%d.\n"
                              ,(ulong)uVar1,0xffffffff);
                      local_4 = -1;
                    }
                    else {
                      local_28[8] = (char)uVar1;
                      uVar2 = aom_rb_read_bit((aom_read_bit_buffer *)((ulong)uVar1 << 0x20));
                      if (local_2c == -1) {
                        fprintf(_stderr,
                                "av1c: Error reading bit for chroma_subsampling_y, value=%d result=%d.\n"
                                ,(ulong)uVar2,0xffffffff);
                        local_4 = -1;
                      }
                      else {
                        local_28[9] = (char)uVar2;
                        uVar3 = aom_rb_read_literal((aom_read_bit_buffer *)
                                                    (ulong)in_stack_ffffffffffffff70,
                                                    in_stack_ffffffffffffff6c);
                        if (local_2c == -1) {
                          fprintf(_stderr,
                                  "av1c: Could not read bits for chroma_sample_position, value=%d result=%d.\n"
                                  ,(ulong)uVar3,0xffffffff);
                          local_4 = -1;
                        }
                        else {
                          local_28[10] = (char)uVar3;
                          uVar4 = aom_rb_read_literal((aom_read_bit_buffer *)((ulong)uVar3 << 0x20),
                                                      in_stack_ffffffffffffff6c);
                          if (local_2c == -1) {
                            fprintf(_stderr,
                                    "av1c: Could not read bits for reserved, value=%d result=%d.\n",
                                    (ulong)uVar4,0xffffffff);
                            local_4 = -1;
                          }
                          else {
                            uVar1 = aom_rb_read_bit((aom_read_bit_buffer *)CONCAT44(uVar1,uVar2));
                            if (local_2c == -1) {
                              fprintf(_stderr,
                                      "av1c: Error reading bit for initial_presentation_delay_present, value=%d result=%d.\n"
                                      ,(ulong)uVar1,0xffffffff);
                              local_4 = -1;
                            }
                            else {
                              local_28[0xb] = (char)uVar1;
                              uVar1 = aom_rb_read_literal((aom_read_bit_buffer *)
                                                          CONCAT44(uVar3,uVar4),uVar1);
                              if (local_2c == -1) {
                                fprintf(_stderr,
                                        "av1c: Could not read bits for initial_presentation_delay_minus_one, value=%d result=%d.\n"
                                        ,(ulong)uVar1,0xffffffff);
                                local_4 = -1;
                              }
                              else {
                                local_28[0xc] = (char)uVar1;
                                sVar5 = aom_rb_bytes_read(&local_58);
                                *local_20 = sVar5;
                                local_4 = 0;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return local_4;
}

Assistant:

int read_av1config(const uint8_t *buffer, size_t buffer_length,
                   size_t *bytes_read, Av1Config *config) {
  if (!buffer || buffer_length < kAv1cSize || !bytes_read || !config) return -1;

  *bytes_read = 0;

  int result = 0;
  struct aom_read_bit_buffer reader_instance = { buffer, buffer + buffer_length,
                                                 0, &result,
                                                 bitreader_error_handler };
  struct aom_read_bit_buffer *reader = &reader_instance;

  memset(config, 0, sizeof(*config));

  AV1C_READ_BIT_OR_RETURN_ERROR(marker);
  config->marker = marker;

  AV1C_READ_BITS_OR_RETURN_ERROR(version, 7);
  config->version = version;

  AV1C_READ_BITS_OR_RETURN_ERROR(seq_profile, 3);
  config->seq_profile = seq_profile;

  AV1C_READ_BITS_OR_RETURN_ERROR(seq_level_idx_0, 5);
  config->seq_level_idx_0 = seq_level_idx_0;

  AV1C_READ_BIT_OR_RETURN_ERROR(seq_tier_0);
  config->seq_tier_0 = seq_tier_0;

  AV1C_READ_BIT_OR_RETURN_ERROR(high_bitdepth);
  config->high_bitdepth = high_bitdepth;

  AV1C_READ_BIT_OR_RETURN_ERROR(twelve_bit);
  config->twelve_bit = twelve_bit;

  AV1C_READ_BIT_OR_RETURN_ERROR(monochrome);
  config->monochrome = monochrome;

  AV1C_READ_BIT_OR_RETURN_ERROR(chroma_subsampling_x);
  config->chroma_subsampling_x = chroma_subsampling_x;

  AV1C_READ_BIT_OR_RETURN_ERROR(chroma_subsampling_y);
  config->chroma_subsampling_y = chroma_subsampling_y;

  AV1C_READ_BITS_OR_RETURN_ERROR(chroma_sample_position, 2);
  config->chroma_sample_position = chroma_sample_position;

  AV1C_READ_BITS_OR_RETURN_ERROR(reserved, 3);

  AV1C_READ_BIT_OR_RETURN_ERROR(initial_presentation_delay_present);
  config->initial_presentation_delay_present =
      initial_presentation_delay_present;

  AV1C_READ_BITS_OR_RETURN_ERROR(initial_presentation_delay_minus_one, 4);
  config->initial_presentation_delay_minus_one =
      initial_presentation_delay_minus_one;

  *bytes_read = aom_rb_bytes_read(reader);

  return 0;
}